

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O2

void pltcalc::loadoccurrence(void)

{
  FILE *__stream;
  int date_opts;
  period_occ p;
  occurrence occ;
  
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    fread(&date_opts,4,1,__stream);
    date_algorithm_ = date_opts & 1;
    granular_date_ = date_opts >> 1;
    if ((uint)date_opts < 2) {
      loadoccurrence<occurrence,period_occ,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>>
                (&occ,&p,(map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
                          *)m_occ_legacy,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular,period_occ_granular,std::map<int,std::vector<period_occ_granular,std::allocator<period_occ_granular>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ_granular,std::allocator<period_occ_granular>>>>>>
                ((occurrence_granular *)&occ,(period_occ_granular *)&p,
                 (map<int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ_granular,_std::allocator<period_occ_granular>_>_>_>_>
                  *)m_occ_granular,(FILE *)__stream);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"FATAL: %s: Error opening file %s\n","loadoccurrence","input/occurrence.bin");
  exit(-1);
}

Assistant:

void loadoccurrence()
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		date_algorithm_ = date_opts & 1;
		granular_date_ = date_opts >> 1;

		if (granular_date_) {
			occurrence_granular occ;
			period_occ_granular p;
			loadoccurrence(occ, p, m_occ_granular, fin);
		} else {
			occurrence occ;
			period_occ p;
			loadoccurrence(occ, p, m_occ_legacy, fin);
		}

		fclose(fin);
	}